

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O2

Raster * rw::d3d::rasterCreate(Raster *raster)

{
  int iVar1;
  FILE *pFVar2;
  int32 numlevels;
  ulong uVar3;
  undefined8 uVar4;
  void *pvVar5;
  char *pcVar6;
  uint uVar7;
  uint32 usage;
  int iVar8;
  int32 width;
  undefined4 uVar9;
  long lVar10;
  Raster *pRVar11;
  Error _e;
  
  uVar7 = raster->format;
  iVar8 = 8;
  if (uVar7 == 0) {
    if ((raster->type & 0xfffffffbU) == 0) {
      raster->format = 0x500;
      uVar7 = 0x500;
    }
    else {
      uVar7 = 0;
    }
LAB_00112a79:
    uVar3 = (ulong)(uVar7 >> 4 & 0xf0);
    uVar9 = *(undefined4 *)(formatInfoRW + uVar3);
    iVar8 = *(int *)(formatInfoRW + uVar3 + 4);
  }
  else {
    if ((uVar7 & 0x6000) == 0) goto LAB_00112a79;
    uVar9 = 0x29;
  }
  lVar10 = (long)nativeRasterOffset;
  *(undefined4 *)((long)&raster->height + lVar10) = uVar9;
  raster->depth = iVar8;
  *(int *)((long)&raster->depth + lVar10) = iVar8 / 8;
  *(bool *)((long)&raster->stride + lVar10) = (0x2aU >> (uVar7 >> 8 & 0xf) & 1) != 0;
  iVar1 = raster->width;
  raster->stride = (iVar8 / 8) * iVar1;
  usage = ~uVar7;
  *(bool *)((long)&raster->stride + lVar10 + 2) = (usage & 0x9000) == 0;
  pRVar11 = raster;
  if ((iVar1 == 0) || (raster->height == 0)) {
    *(byte *)&raster->flags = (byte)raster->flags | 0x80;
    raster->stride = 0;
    goto LAB_00112b78;
  }
  if ((raster->flags & 0x80) != 0) goto LAB_00112b78;
  if ((raster->type & 0xfffffffbU) != 0) {
    _e.plugin = 0xb00;
    _e.code = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp",0x22c);
    pFVar2 = _stderr;
    pcVar6 = dbgsprint(0x8000000a);
    fprintf(pFVar2,"%s\n",pcVar6);
    setError(&_e);
    return (Raster *)0x0;
  }
  lVar10 = (long)nativeRasterOffset;
  if (*(int *)((long)&raster->height + lVar10) == 0x29) {
    usage = 0x143998;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp line: 419"
    ;
    uVar4 = (*DAT_00143848)(0x400,0x30b00);
    *(undefined8 *)((long)&raster->flags + lVar10) = uVar4;
  }
  numlevels = 0;
  if (*(char *)((long)&raster->stride + lVar10 + 2) == '\0') {
    uVar7 = raster->width;
    width = raster->height;
    if ((raster->format & 0x8000) != 0) {
      numlevels = Raster::calculateNumLevels((Raster *)(ulong)uVar7,width,0);
      goto LAB_00112b5c;
    }
    numlevels = 1;
  }
  else {
LAB_00112b5c:
    uVar7 = raster->width;
    width = raster->height;
  }
  pvVar5 = createTexture(uVar7,width,numlevels,usage,*(uint32 *)((long)&raster->height + lVar10));
  *(void **)((long)&raster->platform + lVar10) = pvVar5;
  if (pvVar5 == (void *)0x0) {
    _e.plugin = 0xb00;
    _e.code = 0x8000000b;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp",0x1b1);
    pFVar2 = _stderr;
    pcVar6 = dbgsprint(0x8000000b);
    fprintf(pFVar2,"%s\n",pcVar6);
    setError(&_e);
    pRVar11 = (Raster *)0x0;
  }
LAB_00112b78:
  raster->originalWidth = raster->width;
  raster->originalHeight = raster->height;
  raster->originalStride = raster->stride;
  raster->originalPixels = raster->pixels;
  return pRVar11;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	rasterSetFormat(raster);

	Raster *ret = raster;

	if(raster->width == 0 || raster->height == 0){
		raster->flags |= Raster::DONTALLOCATE;
		raster->stride = 0;
		goto ret;
	}
	if(raster->flags & Raster::DONTALLOCATE)
		goto ret;

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		ret = rasterCreateTexture(raster);
		break;

#ifdef RW_D3D9
	case Raster::CAMERATEXTURE:
		ret = rasterCreateCameraTexture(raster);
		break;
	case Raster::ZBUFFER:
		ret = rasterCreateZbuffer(raster);
		break;
	case Raster::CAMERA:
		ret = rasterCreateCamera(raster);
		break;
#endif

	default:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

ret:
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalStride = raster->stride;
	raster->originalPixels = raster->pixels;
	return ret;
}